

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O1

boolean decode_mcu_DC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int *piVar1;
  jpeg_entropy_decoder *pjVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar2[3].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    piVar1 = (int *)((long)&pjVar2[3].start_pass + 4);
    *piVar1 = *piVar1 + -1;
  }
  if (0 < cinfo->blocks_in_MCU) {
    iVar3 = cinfo->Al;
    lVar5 = 0;
    do {
      iVar4 = arith_decode(cinfo,(uchar *)(pjVar2 + 0xe));
      if (iVar4 != 0) {
        (*MCU_data[lVar5])[0] = (*MCU_data[lVar5])[0] | (ushort)(1 << ((byte)iVar3 & 0x1f));
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_refine(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  unsigned char *st;
  int p1, blkn;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  st = entropy->fixed_bin;      /* use fixed probability estimation */
  p1 = 1 << cinfo->Al;          /* 1 in the bit position being coded */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    /* Encoded data is simply the next bit of the two's-complement DC value */
    if (arith_decode(cinfo, st))
      MCU_data[blkn][0][0] |= p1;
  }

  return TRUE;
}